

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_cache_lcp_2way_parallel<false,unsigned_short>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          unsigned_short *cache_input,unsigned_short *cache_output,size_t n)

{
  size_t __n;
  uchar uVar1;
  byte *pbVar2;
  byte *pbVar3;
  uchar *puVar4;
  int iVar5;
  ostream *poVar6;
  uchar **ppuVar7;
  uchar *puVar8;
  unsigned_short uVar9;
  unsigned_short *puVar10;
  unsigned_short *cache_input0;
  uchar **ppuVar11;
  lcp_t lVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  byte bVar16;
  lcp_t *plVar17;
  uchar uVar18;
  long lVar19;
  MergeResult MVar20;
  ulong uVar21;
  size_t n_00;
  MergeResult local_98;
  char local_91;
  lcp_t *local_90;
  unsigned_short *local_88;
  MergeResult local_7c;
  uchar **local_78;
  unsigned_short *local_70;
  lcp_t *local_68;
  unsigned_short *local_60;
  ulong local_58;
  lcp_t *local_50;
  uchar **local_48;
  unsigned_short *local_40;
  ulong local_38;
  
  local_88 = cache_input;
  local_70 = cache_output;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"mergesort_cache_lcp_2way_parallel",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): n=",6);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  local_91 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_91,1);
  puVar10 = local_70;
  local_60 = local_88;
  if (0x1f < n) {
    uVar21 = n >> 1;
    local_90 = lcp_output;
    local_7c = mergesort_cache_lcp_2way_parallel<true,unsigned_short>
                         (strings_input,strings_output,lcp_input,lcp_output,local_88,local_70,uVar21
                         );
    local_38 = n & 0xfffffffffffffffe;
    local_60 = (unsigned_short *)((long)local_60 + local_38);
    local_40 = (unsigned_short *)(local_38 + (long)puVar10);
    n_00 = n - uVar21;
    ppuVar7 = strings_input + uVar21;
    local_48 = strings_output + uVar21;
    local_68 = lcp_input + uVar21;
    local_50 = local_90 + uVar21;
    local_78 = strings_output;
    local_58 = uVar21;
    if (local_7c == SortedInPlace) {
      check_input<unsigned_short>(strings_input,lcp_input,local_88,uVar21);
      puVar10 = local_60;
      plVar17 = local_68;
      local_98 = mergesort_cache_lcp_2way_parallel<true,unsigned_short>
                           (ppuVar7,local_48,local_68,local_50,local_60,local_40,n_00);
      check_input<unsigned_short>(ppuVar7,plVar17,puVar10,n_00);
      if (local_7c == local_98) {
        merge_cache_lcp_2way<false,unsigned_short>
                  (strings_input,lcp_input,local_88,local_58,ppuVar7,local_68,local_60,n_00,local_78
                   ,local_90,local_70);
        return SortedInTemp;
      }
    }
    else {
      check_input<unsigned_short>(strings_output,local_90,puVar10,uVar21);
      puVar10 = local_40;
      ppuVar11 = local_48;
      plVar17 = local_50;
      local_98 = mergesort_cache_lcp_2way_parallel<true,unsigned_short>
                           (ppuVar7,local_48,local_68,local_50,local_60,local_40,n_00);
      check_input<unsigned_short>(ppuVar11,plVar17,puVar10,n_00);
      puVar10 = local_88;
      cache_input0 = local_70;
      if (local_7c == local_98) goto LAB_0024cd23;
    }
    cache_input0 = local_70;
    MVar20 = local_7c;
    puVar10 = local_88;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"Warning: extra copying due to m0 != m1. n=",0x2a);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    __n = local_58 * 8;
    if (MVar20 == SortedInPlace) {
      memmove(local_78,strings_input,__n);
      memcpy(cache_input0,puVar10,local_38);
      memcpy(local_90,lcp_input,__n);
      MVar20 = SortedInTemp;
    }
    else {
      memmove(strings_input,local_78,__n);
      memcpy(puVar10,cache_input0,local_38);
      memcpy(lcp_input,local_90,__n);
      local_98 = SortedInTemp;
    }
    plVar17 = local_50;
    if (MVar20 != local_98) {
      __assert_fail("m0 == m1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x5e2,
                    "MergeResult mergesort_cache_lcp_2way_parallel(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = false, CharT = unsigned short]"
                   );
    }
LAB_0024cd23:
    merge_cache_lcp_2way<false,unsigned_short>
              (local_78,local_90,cache_input0,local_58,local_48,plVar17,local_40,n_00,strings_input,
               lcp_input,puVar10);
    return SortedInPlace;
  }
  if (1 < n) {
    uVar21 = n & 0xffffffff;
    ppuVar7 = strings_input;
    do {
      pbVar2 = ppuVar7[1];
      ppuVar7 = ppuVar7 + 1;
      for (ppuVar11 = ppuVar7; strings_input < ppuVar11; ppuVar11 = ppuVar11 + -1) {
        pbVar3 = ppuVar11[-1];
        bVar14 = *pbVar3;
        bVar16 = *pbVar2;
        if (bVar14 != 0 && bVar14 == bVar16) {
          lVar19 = 1;
          do {
            bVar14 = pbVar3[lVar19];
            bVar16 = pbVar2[lVar19];
            if (bVar14 == 0) break;
            lVar19 = lVar19 + 1;
          } while (bVar14 == bVar16);
        }
        if (bVar14 <= bVar16) break;
        *ppuVar11 = pbVar3;
      }
      iVar5 = (int)uVar21;
      *ppuVar11 = pbVar2;
      uVar21 = (ulong)(iVar5 - 1);
    } while (2 < iVar5);
  }
  puVar4 = *strings_input;
  puVar8 = strings_input[1];
  uVar18 = *puVar4;
  if (uVar18 == '\0') {
    *lcp_input = 0;
  }
  else {
    lVar12 = 0;
    uVar1 = uVar18;
    do {
      if (uVar1 != puVar8[lVar12]) break;
      uVar1 = puVar4[lVar12 + 1];
      lVar12 = lVar12 + 1;
    } while (uVar1 != '\0');
    *lcp_input = lVar12;
    if (uVar18 != '\0') {
      uVar9 = CONCAT11(uVar18,puVar4[1]);
      goto LAB_0024cab6;
    }
  }
  uVar9 = 0;
LAB_0024cab6:
  *local_88 = uVar9;
  if (1 < n - 1) {
    uVar21 = 1;
    uVar15 = 1;
    do {
      uVar13 = (ulong)(uVar15 + 1);
      puVar4 = strings_input[uVar13];
      lVar12 = 0;
      uVar18 = *puVar8;
      while ((uVar18 != '\0' && (uVar18 == puVar4[lVar12]))) {
        lVar19 = lVar12 + 1;
        lVar12 = lVar12 + 1;
        uVar18 = puVar8[lVar19];
      }
      lcp_input[uVar21] = lVar12;
      if (puVar8[lcp_input[uVar15 - 1]] == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = CONCAT11(puVar8[lcp_input[uVar15 - 1]],puVar8[lcp_input[uVar15 - 1] + 1]);
      }
      local_88[uVar21] = uVar9;
      puVar8 = puVar4;
      uVar21 = uVar13;
      uVar15 = uVar15 + 1;
    } while (uVar13 < n - 1);
  }
  puVar4 = strings_input[n - 1];
  if (puVar4 != (uchar *)0x0) {
    if (puVar4[lcp_input[n - 2]] == '\0') {
      uVar9 = 0;
    }
    else {
      uVar9 = CONCAT11(puVar4[lcp_input[n - 2]],puVar4[lcp_input[n - 2] + 1]);
    }
    local_88[n - 1] = uVar9;
    check_input<unsigned_short>(strings_input,lcp_input,local_88,n);
    return SortedInPlace;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way_parallel(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0, m1;
	m0 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	m1 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}